

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>::Prepend
          (SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> *this,Recycler *allocator,
          FieldAccessStats **data)

{
  SListNode<Js::FieldAccessStats*,Memory::Recycler> *ptr;
  Recycler *alloc;
  SListNode<Js::FieldAccessStats*,Memory::Recycler> *this_00;
  Type *pTVar1;
  Type *this_01;
  TrackAllocData local_58;
  SListNode<Js::FieldAccessStats*,Memory::Recycler> *local_30;
  Node *newNode;
  FieldAccessStats **data_local;
  Recycler *allocator_local;
  SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> *this_local;
  
  newNode = (Node *)data;
  data_local = (FieldAccessStats **)allocator;
  allocator_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&SListNode<Js::FieldAccessStats*,Memory::Recycler>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
             ,0x13b);
  alloc = Memory::Recycler::TrackAllocInfo(allocator,&local_58);
  this_00 = (SListNode<Js::FieldAccessStats*,Memory::Recycler> *)
            new<Memory::Recycler>(0x10,alloc,0x446fd0);
  SListNode<Js::FieldAccessStats*,Memory::Recycler>::SListNode<Js::FieldAccessStats*>
            (this_00,(FieldAccessStats **)newNode);
  if (this_00 != (SListNode<Js::FieldAccessStats*,Memory::Recycler> *)0x0) {
    local_30 = this_00;
    pTVar1 = SListNodeBase<Memory::Recycler>::Next(&this->super_SListNodeBase<Memory::Recycler>);
    this_01 = SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)local_30);
    Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::operator=(this_01,pTVar1);
    ptr = local_30;
    pTVar1 = SListNodeBase<Memory::Recycler>::Next(&this->super_SListNodeBase<Memory::Recycler>);
    Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::operator=
              (pTVar1,(SListNodeBase<Memory::Recycler> *)ptr);
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 != (SListNode<Js::FieldAccessStats*,Memory::Recycler> *)0x0;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }